

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O3

int dtype_convert_simple(void *dst,char *dstdtype,void *src,char *srcdtype,size_t nmemb)

{
  int iVar1;
  BigArrayIter src_iter;
  BigArrayIter dst_iter;
  BigArray src_array;
  BigArray dst_array;
  size_t local_6a8;
  BigArrayIter local_6a0;
  BigArrayIter local_588;
  BigArray local_470;
  BigArray local_250;
  
  local_6a8 = nmemb;
  big_array_init(&local_250,dst,dstdtype,1,&local_6a8,(ptrdiff_t *)0x0);
  big_array_init(&local_470,src,srcdtype,1,&local_6a8,(ptrdiff_t *)0x0);
  big_array_iter_init(&local_588,&local_250);
  big_array_iter_init(&local_6a0,&local_470);
  iVar1 = _dtype_convert(&local_588,&local_6a0,nmemb);
  return iVar1;
}

Assistant:

static int
dtype_convert_simple(void * dst, const char * dstdtype, const void * src, const char * srcdtype, size_t nmemb)
{
    BigArray dst_array, src_array;
    BigArrayIter dst_iter, src_iter;
    big_array_init(&dst_array, dst, dstdtype, 1, &nmemb, NULL);
    big_array_init(&src_array, (void*) src, srcdtype, 1, &nmemb, NULL);
    big_array_iter_init(&dst_iter, &dst_array);
    big_array_iter_init(&src_iter, &src_array);
    return _dtype_convert(&dst_iter, &src_iter, nmemb);
}